

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey_comparison(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  int32_t ecount;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  secp256k1_xonly_pubkey pk2;
  secp256k1_xonly_pubkey pk1;
  uchar pk2_ser [32];
  uchar pk1_ser [32];
  _func_void_char_ptr_void_ptr *in_stack_fffffffffffffed8;
  secp256k1_context *in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff30;
  int iVar5;
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff38;
  secp256k1_context *in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff68;
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff70;
  secp256k1_context *in_stack_ffffffffffffff78;
  
  iVar4 = secp256k1_xonly_pubkey_parse
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x7a,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk1, pk1_ser) == 1");
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_parse
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x7b,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk2, pk2_ser) == 1");
    abort();
  }
  iVar5 = 0;
  p_Var1 = (CTX->illegal_callback).fn;
  pvVar2 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(void *)0x15c5e9);
  iVar4 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     (secp256k1_xonly_pubkey *)CONCAT44(iVar5,in_stack_ffffffffffffff30));
  psVar3 = CTX;
  if (-1 < iVar4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x7d,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, NULL, &pk2) < 0");
    abort();
  }
  (CTX->illegal_callback).fn = p_Var1;
  (psVar3->illegal_callback).data = pvVar2;
  if (iVar5 == 1) {
    p_Var1 = (CTX->illegal_callback).fn;
    pvVar2 = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(void *)0x15c6f4);
    iVar4 = secp256k1_xonly_pubkey_cmp
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       (secp256k1_xonly_pubkey *)CONCAT44(iVar5,in_stack_ffffffffffffff30));
    psVar3 = CTX;
    if (0 < iVar4) {
      (CTX->illegal_callback).fn = p_Var1;
      (psVar3->illegal_callback).data = pvVar2;
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0x7e,"test condition failed: _calls_to_callback == 1");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x7e,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, NULL) > 0");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
          ,0x7d,"test condition failed: _calls_to_callback == 1");
  abort();
}

Assistant:

static void test_xonly_pubkey_comparison(void) {
    unsigned char pk1_ser[32] = {
        0x58, 0x84, 0xb3, 0xa2, 0x4b, 0x97, 0x37, 0x88, 0x92, 0x38, 0xa6, 0x26, 0x62, 0x52, 0x35, 0x11,
        0xd0, 0x9a, 0xa1, 0x1b, 0x80, 0x0b, 0x5e, 0x93, 0x80, 0x26, 0x11, 0xef, 0x67, 0x4b, 0xd9, 0x23
    };
    const unsigned char pk2_ser[32] = {
        0xde, 0x36, 0x0e, 0x87, 0x59, 0x8f, 0x3c, 0x01, 0x36, 0x2a, 0x2a, 0xb8, 0xc6, 0xf4, 0x5e, 0x4d,
        0xb2, 0xc2, 0xd5, 0x03, 0xa7, 0xf9, 0xf1, 0x4f, 0xa8, 0xfa, 0x95, 0xa8, 0xe9, 0x69, 0x76, 0x1c
    };
    secp256k1_xonly_pubkey pk1;
    secp256k1_xonly_pubkey pk2;

    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk1, pk1_ser) == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk2, pk2_ser) == 1);

    CHECK_ILLEGAL_VOID(CTX, CHECK(secp256k1_xonly_pubkey_cmp(CTX, NULL, &pk2) < 0));
    CHECK_ILLEGAL_VOID(CTX, CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, NULL) > 0));
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk2) == 0);
    memset(&pk1, 0, sizeof(pk1)); /* illegal pubkey */
    CHECK_ILLEGAL_VOID(CTX, CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0));
    {
        int32_t ecount = 0;
        secp256k1_context_set_illegal_callback(CTX, counting_callback_fn, &ecount);
        CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0);
        CHECK(ecount == 2);
        secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
    }
    CHECK_ILLEGAL_VOID(CTX, CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0));
}